

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_JPEG_Image.cxx
# Opt level: O0

void jpeg_mem_src(j_decompress_ptr cinfo,uchar *data)

{
  jpeg_source_mgr *pjVar1;
  my_src_ptr src;
  uchar *data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = (jpeg_source_mgr *)malloc(0x48);
  cinfo->src = pjVar1;
  pjVar1 = cinfo->src;
  pjVar1->init_source = init_source;
  pjVar1->fill_input_buffer = fill_input_buffer;
  pjVar1->skip_input_data = skip_input_data;
  pjVar1->resync_to_restart = jpeg_resync_to_restart;
  pjVar1->term_source = term_source;
  pjVar1->bytes_in_buffer = 0;
  pjVar1->next_input_byte = (JOCTET *)0x0;
  pjVar1[1].next_input_byte = data;
  pjVar1[1].bytes_in_buffer = (size_t)data;
  return;
}

Assistant:

static void jpeg_mem_src(j_decompress_ptr cinfo, const unsigned char *data)
{
  my_src_ptr src;
  cinfo->src = (struct jpeg_source_mgr *)malloc(sizeof(my_source_mgr));
  src = (my_src_ptr)cinfo->src;
  src->pub.init_source = init_source;
  src->pub.fill_input_buffer = fill_input_buffer;
  src->pub.skip_input_data = skip_input_data;
  src->pub.resync_to_restart = jpeg_resync_to_restart;
  src->pub.term_source = term_source;
  src->pub.bytes_in_buffer = 0; /* forces fill_input_buffer on first read */
  src->pub.next_input_byte = NULL; /* until buffer loaded */
  src->data = data;
  src->s = data;
}